

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

bool __thiscall
gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::isValid
          (Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *this,long i,long k)

{
  bool bVar1;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *in_RDI;
  int j;
  store_t_conflict in_stack_ffffffffffffffce;
  int local_24;
  
  local_24 = 0;
  while( true ) {
    if (in_RDI->depth <= local_24) {
      return true;
    }
    bVar1 = isValidS(in_RDI,in_stack_ffffffffffffffce);
    if (!bVar1) break;
    local_24 = local_24 + 1;
  }
  return false;
}

Assistant:

bool isValid(long i, long k) const
    {
      for (int j=0; j<depth; j++)
      {
        if (!isValidS(img[j][k][i]))
        {
          return false;
        }
      }

      return true;
    }